

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auto_annotate.cpp
# Opt level: O3

void snestistics::guess_range
               (Trace *trace,RomAccessor *rom,AnnotationResolver *annotations,string *output_file)

{
  _Rb_tree_color _Var1;
  pointer pAVar2;
  pointer pcVar3;
  pointer pFVar4;
  byte bVar5;
  bool bVar6;
  Pointer PVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  Hint *pHVar11;
  _Base_ptr p_Var12;
  _Rb_tree_node_base *p_Var13;
  bool bVar14;
  _Rb_tree_color _Var15;
  int iVar16;
  int iVar17;
  uint *puVar18;
  uint *puVar19;
  uint *puVar20;
  _Rb_tree_color _Var21;
  _Rb_tree_color _Var22;
  uint uVar23;
  _Rb_tree_header *p_Var24;
  Pointer *pPVar25;
  pointer pAVar26;
  _Self __tmp;
  char cVar27;
  uint uVar28;
  pointer pFVar29;
  Pointer jump_target;
  Pointer jump_secondary_target;
  FoundRange found;
  vector<unsigned_int,_std::allocator<unsigned_int>_> merged_with;
  vector<FoundRange,_std::allocator<FoundRange>_> found_ranges;
  uint local_138;
  uint local_134;
  uint local_128;
  _Rb_tree_color local_11c;
  AnnotationResolver *local_118;
  uint *local_110;
  Pointer *local_108;
  uint *local_100;
  int local_f8;
  Pointer local_f4;
  FILE *local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [24];
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  undefined1 local_b0 [24];
  _Base_ptr local_98;
  undefined1 local_88 [48];
  vector<FoundRange,_std::allocator<FoundRange>_> local_58;
  pointer local_38;
  
  local_118 = annotations;
  local_f0 = fopen((output_file->_M_dataplus)._M_p,"wt");
  local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var24 = &(trace->ops)._M_t._M_impl.super__Rb_tree_header;
  p_Var12 = (trace->ops)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pFVar4 = local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  while (local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
         super__Vector_impl_data._M_start = pFVar4, (_Rb_tree_header *)p_Var12 != p_Var24) {
    local_e8._0_8_ = (Annotation *)0xffffffffffffffff;
    local_e8._9_7_ = (undefined7)((ulong)local_e8._8_8_ >> 8);
    local_e8[8] = 1;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffff;
    local_d8._8_4_ = _S_red;
    local_d8._16_8_ = (_Base_ptr)0x0;
    local_c0 = (_Base_ptr)(local_d8 + 8);
    local_b0._0_8_ = 0;
    local_b8 = local_c0;
    do {
      _Var15 = p_Var12[1]._M_color;
      local_88._24_8_ = (_Base_ptr)0x0;
      AnnotationResolver::resolve_annotation
                (local_118,_Var15,(Annotation **)(local_88 + 0x18),(Annotation **)0x0);
      if ((_Base_ptr)local_88._24_8_ != (_Base_ptr)0x0) break;
      bVar5 = RomAccessor::evalByte(rom,_Var15);
      if (local_e8._0_4_ == 0xffffffff) {
        local_e8._0_4_ = _Var15;
      }
      if ((&jump_or_branch)[bVar5] == '\x01') {
        pHVar11 = AnnotationResolver::hint(local_118,_Var15);
        if ((pHVar11 == (Hint *)0x0) || (cVar27 = '\x01', (pHVar11->hints & 0x20) == 0)) {
          cVar27 = (&branches8)[bVar5];
        }
        bVar6 = decode_static_jump(bVar5,rom,_Var15,&local_11c,&local_f4);
        if ((cVar27 != '\0') && (((local_11c ^ _Var15) < 0x10000 && local_11c != ~_S_red) && bVar6))
        {
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)local_d8,&local_11c);
        }
        if (bVar6 && local_f4 == 0xffffffff) {
          local_e8._4_4_ = _Var15;
          std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back
                    (&local_58,(value_type *)local_e8);
          break;
        }
      }
      else if ((bVar5 - 0x40 < 0x2c) &&
              ((0x80100000001U >> ((ulong)(bVar5 - 0x40) & 0x3f) & 1) != 0)) {
        local_e8._4_4_ = _Var15;
        std::vector<FoundRange,_std::allocator<FoundRange>_>::push_back
                  (&local_58,(value_type *)local_e8);
        break;
      }
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    } while ((_Rb_tree_header *)p_Var12 != p_Var24);
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_d8);
    p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
    pFVar4 = local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  puVar20 = (uint *)((long)local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>.
                           _M_impl.super__Vector_impl_data._M_finish - (long)pFVar4 >> 6);
  local_e8._4_4_ = (undefined4)((ulong)local_e8._0_8_ >> 0x20);
  local_e8._0_4_ = 0xffffffff;
  local_38 = local_58.super__Vector_base<FoundRange,_std::allocator<FoundRange>_>._M_impl.
             super__Vector_impl_data._M_finish;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_88 + 0x18),
             (size_type_conflict)puVar20,(value_type_conflict1 *)local_e8,
             (allocator_type *)&local_11c);
  local_134 = 2;
  iVar8 = 0;
  iVar9 = -1;
  puVar19 = (uint *)0x0;
  local_100 = puVar20;
  do {
    puVar20 = puVar19;
    if (local_100 == puVar19) break;
    do {
      puVar18 = puVar20;
      puVar20 = (uint *)(ulong)((_Rb_tree_color *)local_88._24_8_)[(long)puVar18];
    } while (((_Rb_tree_color *)local_88._24_8_)[(long)puVar18] != ~_S_red);
    p_Var24 = &pFVar4[(long)puVar19].branches_out._M_t._M_impl.super__Rb_tree_header;
    p_Var13 = pFVar4[(long)puVar19].branches_out._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_left;
    _Var15 = (_Rb_tree_color)puVar19;
    if ((_Rb_tree_header *)p_Var13 != p_Var24) {
      pFVar29 = pFVar4 + (long)puVar19;
      local_110 = (uint *)(ulong)(_Var15 + _S_black);
      local_108 = &pFVar4[(long)puVar18].stop;
      local_f8 = -iVar8;
      do {
        _Var1 = p_Var13[1]._M_color;
        if ((_Var1 < pFVar29->start) || (pFVar29->stop < _Var1)) {
          local_e8._0_8_ = (Annotation *)0x0;
          AnnotationResolver::resolve_annotation
                    (local_118,_Var1,(Annotation **)local_e8,(Annotation **)0x0);
          if ((Annotation *)local_e8._0_8_ == (Annotation *)0x0) {
            _Var22 = pFVar29->start;
            _Var21 = pFVar29->stop;
            iVar17 = _Var22 - _Var1;
            if (_Var22 < _Var1 || _Var22 - _Var1 == 0) {
              iVar17 = _Var1 - _Var21;
            }
            if (1000 < iVar17) {
              pFVar29->num_long_jumps = pFVar29->num_long_jumps + 1;
            }
            if (_Var1 < _Var22) {
              PVar7 = AnnotationResolver::find_last_free_before_or_at(local_118,_Var22,_Var1);
              if (PVar7 != 0xffffffff) {
                iVar17 = 0;
                do {
                  iVar16 = iVar17;
                  if (iVar9 + iVar16 < 0) break;
                  iVar17 = iVar16 + -1;
                } while (PVar7 <= pFVar4[(uint)(iVar9 + iVar16)].stop);
                if (iVar16 != 0) {
                  _Var1 = iVar16 + local_f8;
                  do {
                    _Var21 = _Var1;
                    _Var1 = ((_Rb_tree_color *)local_88._24_8_)[(int)_Var21];
                    _Var22 = _Var21;
                  } while (((_Rb_tree_color *)local_88._24_8_)[(int)_Var21] != ~_S_red);
                  while (_Var22 = _Var22 + _S_black, _Var22 <= _Var15) {
                    if (pFVar4[_Var22].valid == true) {
                      pFVar4[_Var22].valid = false;
                      ((_Rb_tree_color *)local_88._24_8_)[_Var22] = _Var21;
                    }
                  }
                  pFVar4[(int)_Var21].stop = pFVar29->stop;
                }
              }
            }
            else if ((_Var21 < _Var1) &&
                    (PVar7 = AnnotationResolver::find_last_free_after_or_at(local_118,_Var21,_Var1),
                    uVar23 = local_134, puVar19 = local_110, PVar7 != 0xffffffff)) {
              while ((puVar19 < local_100 && (pFVar4[(long)puVar19].start <= PVar7))) {
                if (pFVar4[(long)puVar19].valid == true) {
                  if (*local_108 < pFVar4[(long)puVar19].stop) {
                    *local_108 = pFVar4[(long)puVar19].stop;
                  }
                  pFVar4[(long)puVar19].valid = false;
                  ((_Rb_tree_color *)local_88._24_8_)[(long)puVar19] = (_Rb_tree_color)puVar18;
                }
                puVar19 = (uint *)(ulong)uVar23;
                uVar23 = uVar23 + 1;
              }
            }
          }
        }
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while ((_Rb_tree_header *)p_Var13 != p_Var24);
    }
    puVar19 = (uint *)(ulong)(_Var15 + _S_black);
    local_134 = local_134 + 1;
    iVar8 = iVar8 + -1;
    iVar9 = iVar9 + 1;
  } while (puVar19 <= local_100);
  if (local_38 == pFVar4) {
    local_128 = 0xffffffff;
    uVar23 = 0;
    uVar28 = 0xffffffff;
    local_138 = 0;
  }
  else {
    uVar28 = 0xffffffff;
    local_110 = (uint *)0x0;
    pPVar25 = (Pointer *)0x0;
    local_138 = 0;
    local_128 = 0xffffffff;
    uVar23 = 0;
    puVar19 = local_100;
    do {
      pFVar29 = pFVar4 + (long)pPVar25;
      if (4 < pFVar4[(long)pPVar25].num_long_jumps) {
        printf("Long jumps to %06X-%06X (%d)\n",(ulong)pFVar29->start,(ulong)pFVar29->stop);
      }
      if (pFVar29->valid == true) {
        pAVar26 = (local_118->_annotations).
                  super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar2 = (local_118->_annotations).
                 super__Vector_base<snestistics::Annotation,_std::allocator<snestistics::Annotation>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_108 = pPVar25;
        if (pAVar26 != pAVar2) {
          bVar6 = false;
          do {
            local_e8._0_4_ = pAVar26->type;
            local_e8._8_8_ = local_d8 + 8;
            pcVar3 = (pAVar26->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_e8 + 8),pcVar3,pcVar3 + (pAVar26->name)._M_string_length);
            local_c0 = (_Base_ptr)local_b0;
            pcVar3 = (pAVar26->comment)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,pcVar3,pcVar3 + (pAVar26->comment)._M_string_length);
            local_b0[0x10] = pAVar26->comment_is_multiline;
            local_98 = (_Base_ptr)local_88;
            pcVar3 = (pAVar26->useComment)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_98,pcVar3,pcVar3 + (pAVar26->useComment)._M_string_length);
            local_88._16_8_ = *(undefined8 *)&pAVar26->startOfRange;
            bVar5 = 0;
            if (local_e8._0_4_ == 1) {
              bVar14 = pFVar29->stop <= (uint)((ulong)local_88._16_8_ >> 0x20) &&
                       (uint)local_88._16_8_ <= pFVar29->stop;
              bVar5 = bVar14 ^ 0x25;
              bVar6 = (bool)(bVar14 | bVar6);
            }
            if (local_98 != (_Base_ptr)local_88) {
              operator_delete(local_98);
            }
            if (local_c0 != (_Base_ptr)local_b0) {
              operator_delete(local_c0);
            }
            if ((undefined1 *)local_e8._8_8_ != local_d8 + 8) {
              operator_delete((void *)local_e8._8_8_);
            }
          } while (((bVar5 == 0x25) || (bVar5 == 0)) && (pAVar26 = pAVar26 + 1, pAVar26 != pAVar2));
          if (bVar6) {
            puts("Collision!");
            puVar19 = local_100;
            pPVar25 = local_108;
            goto LAB_0013f428;
          }
        }
        pPVar25 = local_108;
        uVar10 = pFVar29->stop - pFVar29->start;
        if (local_138 < uVar10) {
          local_128 = uVar23;
        }
        if (local_138 < uVar10) {
          uVar28 = (uint)local_108;
        }
        if (local_138 < uVar10) {
          local_138 = uVar10 + 1;
        }
        uVar23 = uVar23 + 1;
        iVar8 = (int)local_110;
        fprintf(local_f0,"function %06X %06X Auto%04d\n");
        local_110 = (uint *)(ulong)(iVar8 + 1);
        puVar19 = local_100;
      }
LAB_0013f428:
      pPVar25 = (Pointer *)(ulong)((int)pPVar25 + 1);
    } while (pPVar25 < puVar19);
  }
  printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n",(ulong)uVar23,(ulong)local_128,
         (ulong)local_138,(ulong)uVar28);
  fclose(local_f0);
  if ((_Base_ptr)local_88._24_8_ != (_Base_ptr)0x0) {
    operator_delete((void *)local_88._24_8_);
  }
  std::vector<FoundRange,_std::allocator<FoundRange>_>::~vector(&local_58);
  return;
}

Assistant:

void guess_range(const Trace &trace, const RomAccessor &rom, const AnnotationResolver &annotations, std::string &output_file) {

	FILE *output = fopen(output_file.c_str(), "wt");

	int unknownCounter = 0;

	struct FoundRange {
		Pointer start = INVALID_POINTER, stop = INVALID_POINTER;
		bool valid = true;

		bool inside(Pointer p) const { return p >= start && p <= stop; }

		int num_long_jumps = 0;

		std::set<Pointer> branches_out;
	};

	// TODO: Support trace annotation jump is jsr
	std::vector<FoundRange> found_ranges;

	for (auto it = trace.ops.begin(); it != trace.ops.end(); ++it) {
		FoundRange found;
		while (it != trace.ops.end()) {
			Pointer pc = it->first;

			const Annotation *function = nullptr;
			annotations.resolve_annotation(pc, &function);

			// We only want unknown but executed stuff!
			if (function)
				break;

			uint8_t opcode = rom.evalByte(pc);

			if (found.start == INVALID_POINTER)
				found.start = pc;

			if (jump_or_branch[opcode]) {
				const Hint *hint = annotations.hint(pc);
				bool merge_long_jumps = hint && hint->has_hint(Hint::ANNOTATE_MERGE);
				bool relevant_jump = merge_long_jumps || branches8[opcode];

				Pointer jump_target, jump_secondary_target;
				bool op_is_jump_or_branch = decode_static_jump(opcode, rom, pc, &jump_target, &jump_secondary_target);

				bool jump_is_jsr = false;
				if (hint && hint->has_hint(Hint::JUMP_IS_JSR))
					jump_is_jsr = true;

				if (relevant_jump && op_is_jump_or_branch && jump_target != INVALID_POINTER && same_bank(pc, jump_target)) {
					found.branches_out.insert(jump_target);
				}

				// Stop if we find a branch or a jump
				if (op_is_jump_or_branch && jump_secondary_target == INVALID_POINTER) {
					// If there is a secondary jump target (as in a branch) we don't need to stop
					found.stop = pc;
					found_ranges.push_back(found);
					break;
				}
			} else if (opcode == 0x40 || opcode == 0x6B || opcode == 0x60) {
				// Some sort of return (RTS, RTI, RTL)
				found.stop = pc;
				found_ranges.push_back(found);
				break;
			}
			it++;
		}
	}

	std::vector<uint32_t> merged_with(found_ranges.size(), -1);

	for (uint32_t j = 0; j <= found_ranges.size(); ++j) { // TODO: Make <= be just <

		bool debug = false;

		if (debug) {
			printf("Step %d\n", j);

			for (uint32_t ai = 0; ai < found_ranges.size(); ai++) {
				const FoundRange &f = found_ranges[ai];
				printf(" %d: %06X-%06X%s", ai, f.start, f.stop, f.valid ? "" : " (invalid)");
				if (merged_with[ai] != -1)
					printf(" (merged with %d)", merged_with[ai]);
				printf("\n");

				if (ai >= j)
					for (auto b : f.branches_out) {
						if (f.inside(b))
							continue;
						printf("   -> %06X", b);
						for (uint32_t bi = 0; bi < found_ranges.size(); ++bi) {
							const FoundRange &fb = found_ranges[bi];
							if (fb.start <= b && b <= fb.stop)
								printf(" %d", bi);
						}
						printf("\n");
					}
			}
		}

		// We went one extra round for debugging!
		if (j == found_ranges.size())
			break;

		uint32_t merge_target = j;
		while (merged_with[merge_target] != -1)
			merge_target = merged_with[merge_target];

		auto &branches_out = found_ranges[j].branches_out;

		FoundRange &fj = found_ranges[j];

		//printf("Doing %d, saving into %d\n", j, merge_target);
		for (Pointer target : branches_out) {
			// We have three cases; forward, backward or internal branches. We treat them separately for clarity
			if (fj.inside(target)) // Ignore internal branches/jumps
				continue;

			// TODO: This is not enough.. We must stop at any function in the range...
			//       Basically cut target at any function def...
			const Annotation *target_function = nullptr;
			annotations.resolve_annotation(target, &target_function);
			if (target_function)
				continue;

			int len = 0;
			if (target < fj.start) {
				len = fj.start - target;
			}
			else {
				len = target - fj.stop;
			}
			if (len > 1000) {
				fj.num_long_jumps++;
			}

			Pointer t1 = target;

			if (target < fj.start) {
				target = annotations.find_last_free_before_or_at(fj.start, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;
				// Branch going out to smaller addresses (before j)

				int lowest_merge = j;

				for (int32_t t = j - 1; t >= 0; --t) {
					FoundRange &merger = found_ranges[t];
					if (target > merger.stop) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					lowest_merge = t;
				}

				if (lowest_merge == j)
					continue;

				while (merged_with[lowest_merge] != -1)
					lowest_merge = merged_with[lowest_merge];

				// We want to merge the range (lowest_range, ..., j) into lowest_range
				for (uint32_t t = lowest_merge + 1; t <= j; t++) {
					FoundRange &f = found_ranges[t];
					if (f.valid) {
						f.valid = false;
						merged_with[t] = lowest_merge;
					}
				}

				found_ranges[lowest_merge].stop = fj.stop;

			} else if (target > fj.stop) {

				target = annotations.find_last_free_after_or_at(fj.stop, target);
				if (target != t1) {
					int A = 9;
				}

				if (target == INVALID_POINTER)
					continue;

				// Branch going out to larger addresses (after j)
				for (uint32_t t = j + 1; t<found_ranges.size(); ++t) {
					FoundRange &merger = found_ranges[t];
					if (target < merger.start) // Since ranges are sorted on start and non-overlapping we can stop here
						break;
					if (merger.valid) {
						// Merge t into j (the easy case)
						if (merger.stop > found_ranges[merge_target].stop)
							found_ranges[merge_target].stop = merger.stop;
						merger.valid = false; // Since we make it invalid it can only be merged once...
						merged_with[t] = merge_target;
					}
				}
			}
		}
	}

	int num_found = 0;

	int longest = -1, longest_range = -1;
	uint32_t longest_length = 0;

	for (uint32_t fi = 0; fi < found_ranges.size(); ++fi) {
		const FoundRange &f = found_ranges[fi];
		if (f.num_long_jumps > 4) {
			printf("Long jumps to %06X-%06X (%d)\n", f.start, f.stop, f.num_long_jumps);
		}

		if (f.valid) {
			bool collision = false;
			for (auto k : annotations._annotations) {
				if (k.type == AnnotationType::ANNOTATION_FUNCTION) {
					if (f.stop < k.startOfRange || f.stop > k.endOfRange) {
						continue;
					}
					else {
						collision = true;
						break;
					}
				}
			}
			if (collision) {
				printf("Collision!\n");
			}
			else {
				// TODO: Validate that there is no function annotation inside a range
				if (f.stop - f.start > longest_length) {
					longest = num_found;
					longest_length = f.stop - f.start + 1;
					longest_range = fi;
				}
				num_found++;
				fprintf(output, "function %06X %06X Auto%04d\n", f.start, f.stop, unknownCounter++);
			}
		}
	}

	printf("Found %d functions (longest Auto%04d, len=%d, range=%d)\n", num_found, longest, longest_length, longest_range);

	fclose(output);
}